

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayUsageGroup::init
          (SingleVertexArrayUsageGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Usage usage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  InputType type_00;
  GLValue GVar2;
  GLValue GVar3;
  InputType local_1f4;
  undefined1 local_1e8 [8];
  Spec spec;
  undefined4 uStack_1ac;
  undefined1 local_1a0 [8];
  ArraySpec arraySpec;
  string local_140;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string name;
  int iStack_44;
  bool aligned;
  int stride;
  int strideNdx;
  int countNdx;
  int inputTypeNdx;
  InputType inputTypes [4];
  int strides [4];
  int counts [2];
  SingleVertexArrayUsageGroup *this_local;
  
  strides[2] = 1;
  strides[3] = 0x100;
  inputTypes[2] = INPUTTYPE_FLOAT;
  inputTypes[3] = ~INPUTTYPE_FLOAT;
  strides[0] = 0x11;
  strides[1] = 0x20;
  _countNdx = 0x100000000;
  inputTypes[0] = INPUTTYPE_SHORT;
  inputTypes[1] = INPUTTYPE_BYTE;
  strideNdx = 0;
  iVar1 = 4;
  while (strideNdx < 4) {
    for (stride = 0; stride < 2; stride = stride + 1) {
      for (iStack_44 = 0; iStack_44 < 4; iStack_44 = iStack_44 + 1) {
        if ((int)inputTypes[(long)iStack_44 + 2] < 0) {
          iVar1 = deqp::gls::Array::inputTypeSize((&countNdx)[strideNdx]);
          local_1f4 = iVar1 << 1;
        }
        else {
          local_1f4 = inputTypes[(long)iStack_44 + 2];
        }
        iVar1 = deqp::gls::Array::inputTypeSize((&countNdx)[strideNdx]);
        name.field_2._M_local_buf[0xf] = (int)local_1f4 % iVar1 == 0;
        typeToString<int>(&local_110,local_1f4);
        std::operator+(&local_f0,"stride",&local_110);
        std::operator+(&local_d0,&local_f0,"_");
        deqp::gls::Array::inputTypeToString_abi_cxx11_
                  (&local_140,(Array *)(ulong)(uint)(&countNdx)[strideNdx],type_00);
        std::operator+(&local_b0,&local_d0,&local_140);
        std::operator+(&local_90,&local_b0,"_quads");
        typeToString<int>((string *)&arraySpec.max.field_1.fl,strides[(long)stride + 2]);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arraySpec.max.field_1.fl);
        std::__cxx11::string::~string((string *)&arraySpec.max.field_1.fl);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        type = (&countNdx)[strideNdx];
        usage_ = this->m_usage;
        GVar2 = deqp::gls::GLValue::getMinValue(type);
        GVar3 = deqp::gls::GLValue::getMaxValue((&countNdx)[strideNdx]);
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
        max_._4_4_ = spec.arrays.
                     super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        max_.type = (InputType)
                    spec.arrays.
                    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        min_._4_4_ = uStack_1ac;
        min_.type = GVar2.type;
        min_.field_1 = GVar2.field_1;
        max_.field_1 = GVar3.field_1;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_1a0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,local_1f4,
                   false,min_,max_);
        deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_1e8);
        local_1e8._0_4_ = PRIMITIVE_TRIANGLES;
        local_1e8._4_4_ = strides[(long)stride + 2];
        spec.primitive = PRIMITIVE_POINTS;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     *)&spec.first,(value_type *)local_1a0);
        if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
          name_00 = (char *)std::__cxx11::string::c_str();
          desc = (char *)std::__cxx11::string::c_str();
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,testCtx,renderCtx,(Spec *)local_1e8,name_00,desc);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_1e8);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
    strideNdx = strideNdx + 1;
    iVar1 = strideNdx;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayUsageGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					strides[]		= {0, -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const int			stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
				const bool			aligned	= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
				const std::string	name	= "stride" + typeToString(stride) + "_" + Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																m_usage,
																2,
																0,
																stride,
																false,
																GLValue::getMinValue(inputTypes[inputTypeNdx]),
																GLValue::getMaxValue(inputTypes[inputTypeNdx]));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}